

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  cmNinjaVars *this_00;
  cmGeneratorTarget *this_01;
  cmLocalNinjaGenerator *pcVar1;
  cmLocalNinjaGenerator *this_02;
  cmMakefile *this_03;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  TargetType TVar6;
  int iVar7;
  string *psVar8;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *__s;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  cmGeneratedFileStream *os;
  cmOutputConverter *pcVar12;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string_view source_03;
  bool usedResponseFile;
  undefined7 uStack_44f;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_448;
  cmGlobalNinjaGenerator *local_420;
  allocator<char> local_411;
  cmAlphaNum local_410;
  cmOutputConverter *local_3e0;
  undefined1 local_3d8 [48];
  Names tgtNames;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  string targetOutputImplib;
  cmAlphaNum local_280;
  string local_250;
  string objPath;
  string langFlags;
  string linkPath;
  string frameworkPath;
  string local_1b0;
  string createRule;
  cmNinjaBuild build;
  string local_50;
  
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_3e0 = (cmOutputConverter *)output;
  local_420 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetFullPath(&build.Comment,this_01,config,ImportLibraryArtifact,false);
  psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,&build.Comment);
  std::__cxx11::string::string((string *)&targetOutputImplib,(string *)psVar8);
  std::__cxx11::string::~string((string *)&build);
  bVar3 = std::operator!=(config,fileConfig);
  if (bVar3) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
              (&usedResponseFile,pcVar1,this_01);
    build.Comment._M_dataplus._M_p = (pointer)local_448;
    build.Comment._M_string_length = (size_type)_usedResponseFile;
    (*(local_420->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x49])(&local_410,local_420,fileConfig);
    tgtNames.Base._M_dataplus._M_p = local_410.View_._M_str;
    tgtNames.Base._M_string_length = local_410.View_._M_len;
    cmStrCat<char[2]>((string *)&linkLineComputer,(cmAlphaNum *)&build,(cmAlphaNum *)&tgtNames,
                      (char (*) [2])0x677c12);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&usedResponseFile);
    (*(local_420->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
      [0x16])(&build,local_420,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)&linkLineComputer,(string *)&build);
    std::__cxx11::string::~string((string *)&build);
    _Var4 = std::operator==(outputDir,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &linkLineComputer);
    if (_Var4) {
      std::__cxx11::string::~string((string *)&linkLineComputer);
      goto LAB_003646cb;
    }
    cmGeneratorTarget::GetFullName(&build.Comment,this_01,config,ImportLibraryArtifact);
    if (build.Comment._M_string_length != 0) {
      cmGeneratorTarget::GetFullName(&tgtNames.Base,this_01,fileConfig,ImportLibraryArtifact);
      if (tgtNames.Base._M_string_length != 0) {
        cmGeneratorTarget::GetFullPath
                  ((string *)&usedResponseFile,this_01,fileConfig,ImportLibraryArtifact,false);
        psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath
                           (&this->super_cmNinjaTargetGenerator,(string *)&usedResponseFile);
        _Var4 = std::operator==(&targetOutputImplib,psVar8);
        std::__cxx11::string::~string((string *)&usedResponseFile);
        std::__cxx11::string::~string((string *)&tgtNames);
        std::__cxx11::string::~string((string *)&build);
        std::__cxx11::string::~string((string *)&linkLineComputer);
        if (_Var4) goto LAB_003646cb;
        goto LAB_00363b82;
      }
      std::__cxx11::string::~string((string *)&tgtNames);
    }
    std::__cxx11::string::~string((string *)&build);
    std::__cxx11::string::~string((string *)&linkLineComputer);
  }
LAB_00363b82:
  LanguageLinkerDeviceRule(&local_50,this,config);
  cmNinjaBuild::cmNinjaBuild(&build,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  tgtNames.Base._M_dataplus._M_p = &DAT_00000009;
  tgtNames.Base._M_string_length = (size_type)anon_var_dwarf_11d4b52;
  __s = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)GetVisibleTypeName(this);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)strlen((char *)__s);
  pcVar12 = local_3e0;
  local_410.View_._M_len = CONCAT71(local_410.View_._M_len._1_7_,0x20);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = __s;
  cmStrCat<char,std::__cxx11::string>
            ((string *)&usedResponseFile,(cmAlphaNum *)&tgtNames,(cmAlphaNum *)&linkLineComputer,
             (char *)&local_410,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0);
  std::__cxx11::string::operator=((string *)&build,(string *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&build.Outputs,(value_type *)pcVar12);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&tgtNames,&this->super_cmNinjaTargetGenerator,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&build.ExplicitDeps,&tgtNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tgtNames);
  TargetLinkLanguage(&tgtNames.Base,this,config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,&tgtNames.Base,
             config,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&build.ImplicitDeps,&linkLineComputer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&tgtNames);
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  TargetLinkLanguage(&tgtNames.Base,this,config);
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,this_01,&tgtNames.Base,config);
  std::__cxx11::string::~string((string *)&tgtNames);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_3e0 = &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
  ;
  source._M_str = (char *)(pcVar12->StateSnapshot).State;
  source._M_len = (size_t)(pcVar12->StateSnapshot).Position.Tree;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&tgtNames.Base,local_3e0,source,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkLineComputer,"TARGET_FILE",(allocator<char> *)&usedResponseFile);
  this_00 = &build.Variables;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&linkLineComputer);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  std::__cxx11::string::~string((string *)&tgtNames);
  this_02 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar12 = &(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (this_02 == (cmLocalNinjaGenerator *)0x0) {
    pcVar12 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)this_02);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&tgtNames,(cmStateSnapshot *)&usedResponseFile);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,pcVar12,(cmStateDirectory *)&tgtNames,local_420);
  iVar5 = (*(local_420->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[0x26])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar5,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"LINK_LIBRARIES",(allocator<char> *)&local_410);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&tgtNames.Base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"LINK_FLAGS",(allocator<char> *)local_3d8);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar1,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             pmVar9,pmVar10,&frameworkPath,&linkPath,this_01);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"JOB_POOL_LINK",(allocator<char> *)&usedResponseFile);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&tgtNames.Base,this_01,this_00);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"LINK_FLAGS",(allocator<char> *)local_3d8);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&usedResponseFile);
  cmGlobalNinjaGenerator::EncodeLiteral(&tgtNames.Base,local_420,pmVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"LINK_FLAGS",(allocator<char> *)&local_280);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_410);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  cmCommonTargetGenerator::GetManifests(&tgtNames.Base,(cmCommonTargetGenerator *)this,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"MANIFESTS",(allocator<char> *)&local_410);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::operator+(&tgtNames.Base,&frameworkPath,&linkPath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"LINK_PATH",(allocator<char> *)&local_410);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&tgtNames);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&tgtNames);
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"CUDA",(allocator<char> *)&usedResponseFile);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar1,&langFlags,this_01,&tgtNames.Base,config);
  std::__cxx11::string::~string((string *)&tgtNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tgtNames,"LANGUAGE_COMPILE_FLAGS",(allocator<char> *)&usedResponseFile);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&tgtNames.Base);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  std::__cxx11::string::~string((string *)&tgtNames);
  TargetNames(&tgtNames,this,config);
  bVar3 = cmGeneratorTarget::HasSOName(this_01,config);
  if (bVar3) {
    this_03 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    TargetLinkLanguage((string *)&usedResponseFile,this,config);
    cmMakefile::GetSONameFlag(this_03,(string *)&usedResponseFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"SONAME_FLAG",(allocator<char> *)local_3d8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_410);
    std::__cxx11::string::assign((char *)pmVar9);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&usedResponseFile);
    source_00._M_str = tgtNames.SharedObject._M_dataplus._M_p;
    source_00._M_len = tgtNames.SharedObject._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,local_3e0,source_00,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"SONAME",(allocator<char> *)local_3d8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_410);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&usedResponseFile);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&usedResponseFile);
    TVar6 = cmGeneratorTarget::GetType(this_01);
    if (TVar6 == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&usedResponseFile,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      if (local_448 != (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
        source_01._M_str = _usedResponseFile;
        source_01._M_len = (size_t)local_448;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)&local_410,local_3e0,source_01,SHELL);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3d8,"INSTALLNAME_DIR",(allocator<char> *)&local_280);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,(key_type *)local_3d8);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_410);
        std::__cxx11::string::~string((string *)local_3d8);
        std::__cxx11::string::~string((string *)&local_410);
      }
      std::__cxx11::string::~string((string *)&usedResponseFile);
    }
  }
  if (tgtNames.ImportLibrary._M_string_length != 0) {
    source_02._M_str = targetOutputImplib._M_dataplus._M_p;
    source_02._M_len = targetOutputImplib._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&usedResponseFile,local_3e0,source_02,SHELL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"TARGET_IMPLIB",(allocator<char> *)local_3d8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)&local_410);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    std::__cxx11::string::~string((string *)&local_410);
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&targetOutputImplib);
    std::__cxx11::string::~string((string *)&usedResponseFile);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)local_3d8,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  _usedResponseFile = (pointer)local_3d8._8_8_;
  local_448 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_3d8._0_8_;
  (*(local_420->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
  )(&local_280,local_420,config);
  local_410.View_._M_len = (size_t)local_280.View_._M_str;
  local_410.View_._M_str = (char *)local_280.View_._M_len;
  cmStrCat<>(&objPath,(cmAlphaNum *)&usedResponseFile,&local_410);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)local_3d8);
  pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath(&this->super_cmNinjaTargetGenerator,&objPath);
  source_03._M_str = (psVar8->_M_dataplus)._M_p;
  source_03._M_len = psVar8->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            ((string *)&usedResponseFile,
             &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             source_03,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"OBJECT_DIR",(allocator<char> *)local_3d8);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&local_410);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,this_00,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"LINK_LIBRARIES",(allocator<char> *)&local_410);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usedResponseFile,"LINK_PATH",(allocator<char> *)&local_410);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,(key_type *)&usedResponseFile);
  std::__cxx11::string::~string((string *)&usedResponseFile);
  if (local_420->UsingGCCOnWindows == true) {
    _Var2._M_current = (pmVar9->_M_dataplus)._M_p;
    usedResponseFile = true;
    local_410.View_._M_len._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var2._M_current + pmVar9->_M_string_length),&usedResponseFile,
               (char *)&local_410);
    _Var2._M_current = (pmVar10->_M_dataplus)._M_p;
    usedResponseFile = true;
    local_410.View_._M_len = CONCAT71(local_410.View_._M_len._1_7_,0x2f);
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (_Var2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(_Var2._M_current + pmVar10->_M_string_length),&usedResponseFile,
               (char *)&local_410);
  }
  sVar11 = cmSystemTools::CalculateCommandLineLengthLimit();
  iVar5 = cmGlobalNinjaGenerator::GetRuleCmdLength(local_420,&build.Rule);
  _usedResponseFile = &DAT_0000000b;
  local_448 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x64a31a;
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
  local_410.View_._M_str = (psVar8->_M_dataplus)._M_p;
  local_410.View_._M_len = psVar8->_M_string_length;
  iVar7 = (*(local_420->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[0x26])();
  if ((char)iVar7 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_411);
  }
  else {
    local_3d8._8_8_ = local_3d8 + 0x10;
    local_3d8._0_8_ = &DAT_00000001;
    local_3d8[0x10] = '.';
    local_280.View_._M_str = (config->_M_dataplus)._M_p;
    local_280.View_._M_len = config->_M_string_length;
    cmStrCat<>(&local_250,(cmAlphaNum *)local_3d8,&local_280);
  }
  cmStrCat<std::__cxx11::string,char[5]>
            (&local_1b0,(cmAlphaNum *)&usedResponseFile,&local_410,&local_250,(char (*) [5])0x6525e9
            );
  cmNinjaTargetGenerator::ConvertToNinjaPath(&this->super_cmNinjaTargetGenerator,&local_1b0);
  std::__cxx11::string::_M_assign((string *)&build.RspFile);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_250);
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &build.OrderOnlyDeps,config,config,DependOnTargetArtifact);
  _usedResponseFile = _usedResponseFile & 0xffffffffffffff00;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (local_420,(ostream *)os,&build,(int)sVar11 - iVar5,&usedResponseFile);
  WriteNvidiaDeviceLinkRule(this,usedResponseFile,config);
  std::__cxx11::string::~string((string *)&objPath);
  cmGeneratorTarget::Names::~Names(&tgtNames);
  std::__cxx11::string::~string((string *)&langFlags);
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  std::__cxx11::string::~string((string *)&createRule);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  cmNinjaBuild::~cmNinjaBuild(&build);
LAB_003646cb:
  std::__cxx11::string::~string((string *)&targetOutputImplib);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] = globalGen->EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}